

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_commit_sum
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit_out,
              secp256k1_pedersen_commitment **commits,size_t pcnt,
              secp256k1_pedersen_commitment **ncommits,size_t ncnt)

{
  size_t sVar1;
  secp256k1_gej accj;
  secp256k1_ge add;
  secp256k1_ge acc;
  
  secp256k1_gej_set_infinity(&accj);
  for (sVar1 = 0; ncnt != sVar1; sVar1 = sVar1 + 1) {
    secp256k1_pedersen_commitment_load(&add,ncommits[sVar1]);
    secp256k1_gej_add_ge_var(&accj,&accj,&add,(secp256k1_fe *)0x0);
  }
  secp256k1_gej_neg(&accj,&accj);
  for (sVar1 = 0; pcnt != sVar1; sVar1 = sVar1 + 1) {
    secp256k1_pedersen_commitment_load(&add,commits[sVar1]);
    secp256k1_gej_add_ge_var(&accj,&accj,&add,(secp256k1_fe *)0x0);
  }
  if (accj.infinity == 0) {
    secp256k1_ge_set_gej(&acc,&accj);
    secp256k1_pedersen_commitment_save(commit_out,&acc);
  }
  return (uint)(accj.infinity == 0);
}

Assistant:

int secp256k1_pedersen_commit_sum(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit_out,
 const secp256k1_pedersen_commitment * const* commits, size_t pcnt, const secp256k1_pedersen_commitment * const* ncommits, size_t ncnt) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!pcnt || (commits != NULL));
    ARG_CHECK(!ncnt || (ncommits != NULL));
    ARG_CHECK(commit_out != NULL);
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < ncnt; i++) {
        secp256k1_pedersen_commitment_load(&add, ncommits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < pcnt; i++) {
        secp256k1_pedersen_commitment_load(&add, commits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    if (!secp256k1_gej_is_infinity(&accj)) {
        secp256k1_ge acc;
        secp256k1_ge_set_gej(&acc, &accj);
        secp256k1_pedersen_commitment_save(commit_out, &acc);
        ret = 1;
    }
    return ret;
}